

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimage.cpp
# Opt level: O1

void __thiscall CVmImageFileExt_blk::CVmImageFileExt_blk(CVmImageFileExt_blk *this,size_t siz)

{
  char *pcVar1;
  
  pcVar1 = (char *)malloc(siz);
  this->block_ptr_ = pcVar1;
  this->rem_ = siz;
  this->free_ptr_ = pcVar1;
  this->nxt_ = (CVmImageFileExt_blk *)0x0;
  this->prv_ = (CVmImageFileExt_blk *)0x0;
  return;
}

Assistant:

CVmImageFileExt_blk::CVmImageFileExt_blk(size_t siz)
{
    /* allocate the associated memory block */
    block_ptr_ = (char *)t3malloc(siz);

    /* remember the amount of space remaining */
    rem_ = siz;

    /* the next byte free is the first byte */
    free_ptr_ = block_ptr_;

    /* nothing else is in our list yet */
    nxt_ = prv_ = 0;
}